

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

int tkinter2Present(void)

{
  int iVar1;
  char *pcVar2;
  bool local_20a;
  byte local_209;
  undefined1 local_208 [8];
  char lPythonParams [256];
  char lPythonCommand [256];
  
  memcpy(local_208,"-S -c \"try:\n\timport Tkinter;\nexcept:\n\tprint 0;\"",0x100);
  if (tkinter2Present::lTkinter2Present < 0) {
    tkinter2Present::lTkinter2Present = 0;
    iVar1 = python2Present();
    if (iVar1 != 0) {
      sprintf(lPythonParams + 0xf8,"%s %s",gPython2Name,local_208);
      tkinter2Present::lTkinter2Present = tryCommand(lPythonParams + 0xf8);
    }
    if (tinyfd_verbose != 0) {
      printf("lTkinter2Present %d\n",(ulong)(uint)tkinter2Present::lTkinter2Present);
    }
  }
  local_209 = 0;
  if (tkinter2Present::lTkinter2Present != 0) {
    iVar1 = graphicMode();
    local_209 = 0;
    if (iVar1 != 0) {
      iVar1 = isDarwin();
      local_20a = false;
      if (iVar1 != 0) {
        pcVar2 = getenv("SSH_TTY");
        local_20a = pcVar2 != (char *)0x0;
      }
      local_209 = local_20a ^ 0xff;
    }
  }
  return (int)(local_209 & 1);
}

Assistant:

static int tkinter2Present( )
{
    static int lTkinter2Present = -1 ;
        char lPythonCommand[256];
        char lPythonParams[256] =
"-S -c \"try:\n\timport Tkinter;\nexcept:\n\tprint 0;\"";


        if ( lTkinter2Present < 0 )
        {
                lTkinter2Present = 0 ;
                if ( python2Present() )
        {
                    sprintf( lPythonCommand , "%s %s" , gPython2Name , lPythonParams ) ;
                    lTkinter2Present = tryCommand(lPythonCommand) ;
                }
                if (tinyfd_verbose) printf("lTkinter2Present %d\n", lTkinter2Present) ;
        }
        return lTkinter2Present && graphicMode() && !(isDarwin() && getenv("SSH_TTY") );
}